

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void trigger_nrx4_envelope(Emulator *e,Envelope *envelope,Address addr)

{
  undefined1 uVar1;
  byte bVar2;
  char *pcVar3;
  char *func_name;
  
  envelope->volume = envelope->initial_volume;
  uVar1 = envelope->period;
  bVar2 = 8;
  if (uVar1 != 0) {
    bVar2 = uVar1;
  }
  envelope->timer = (uint)bVar2;
  envelope->automatic = TRUE;
  if ((e->state).apu.frame == '\x06') {
    envelope->timer = bVar2 + 1;
  }
  func_name = "unknown";
  if (addr < 0x17) {
    func_name = *(char **)(get_apu_reg_string_s_strings + (ulong)addr * 8);
  }
  pcVar3 = "unknown";
  if (func_name != (char *)0x0) {
    pcVar3 = func_name;
  }
  HOOK_trigger_nrx4_info_asii(e,func_name,(ulong)addr,pcVar3);
  return;
}

Assistant:

static void trigger_nrx4_envelope(Emulator* e, Envelope* envelope,
                                  Address addr) {
  envelope->volume = envelope->initial_volume;
  envelope->timer = envelope->period ? envelope->period : ENVELOPE_MAX_PERIOD;
  envelope->automatic = TRUE;
  /* If the next APU frame will update the envelope, increment the timer. */
  if (UNLIKELY(APU.frame + 1 == FRAME_SEQUENCER_UPDATE_ENVELOPE_FRAME)) {
    envelope->timer++;
  }
  HOOK(trigger_nrx4_info_asii, addr, get_apu_reg_string(addr), envelope->volume,
       envelope->timer);
}